

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O0

void __thiscall MessageQueue::MessageQueue(MessageQueue *this,int key,CreateFlag flag)

{
  int iVar1;
  element_type *this_00;
  shared_ptr<MessageThread> local_38;
  uint local_28;
  int flg;
  CreateFlag local_18;
  int local_14;
  CreateFlag flag_local;
  int key_local;
  MessageQueue *this_local;
  
  local_18 = flag;
  local_14 = key;
  _flag_local = this;
  Signal<std::function<void_(const_Buffer_&)>_>::Signal(&this->signalDataAvailable);
  std::shared_ptr<MessageThread>::shared_ptr(&this->thread);
  pthread_once(&msgInitOnce,msgInit);
  local_28 = 0;
  if (local_18 == Create) {
    local_28 = 0x600;
  }
  iVar1 = msgget(local_14,local_28);
  this->queue = iVar1;
  this->owner = (bool)((byte)(local_28 >> 9) & 1);
  std::make_shared<MessageThread,int&,MessageQueue*>((int *)&local_38,(MessageQueue **)this);
  std::shared_ptr<MessageThread>::operator=(&this->thread,&local_38);
  std::shared_ptr<MessageThread>::~shared_ptr(&local_38);
  this_00 = std::__shared_ptr_access<MessageThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<MessageThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->thread);
  Thread::start(&this_00->super_Thread,Normal,0);
  return;
}

Assistant:

MessageQueue::MessageQueue(int key, CreateFlag flag)
{
    pthread_once(&msgInitOnce, msgInit);
    const int flg = (flag == Create) ? (IPC_CREAT | IPC_EXCL) : 0;
    queue = msgget(key, flg);
    owner = ((flg & IPC_CREAT) == IPC_CREAT);
    thread = std::make_shared<MessageThread>(queue, this);
    thread->start();
}